

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchCnf.c
# Opt level: O1

void Dch_CnfNodeAddToSolver(Dch_Man_t *p,Aig_Obj_t *pObj)

{
  uint uVar1;
  uint uVar2;
  Aig_Obj_t *pNode;
  ulong uVar3;
  int iVar4;
  Vec_Ptr_t *vFrontier;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  void *pvVar8;
  long lVar9;
  
  if (p->pSatVars[pObj->Id] != 0) {
    return;
  }
  vFrontier = (Vec_Ptr_t *)malloc(0x10);
  vFrontier->nCap = 100;
  vFrontier->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  vFrontier->pArray = ppvVar5;
  Dch_ObjAddToFrontier(p,pObj,vFrontier);
  if (0 < vFrontier->nSize) {
    lVar9 = 0;
    do {
      pNode = (Aig_Obj_t *)vFrontier->pArray[lVar9];
      if (p->pSatVars[pNode->Id] == 0) {
        __assert_fail("Dch_ObjSatNum(p,pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/dch/dchCnf.c"
                      ,0x12e,"void Dch_CnfNodeAddToSolver(Dch_Man_t *, Aig_Obj_t *)");
      }
      iVar4 = Aig_ObjIsMuxType(pNode);
      if (iVar4 == 0) {
        Dch_CollectSuper(pNode,1,p->vFanins);
        pVVar6 = p->vFanins;
        if (0 < pVVar6->nSize) {
          lVar7 = 0;
          do {
            Dch_ObjAddToFrontier
                      (p,(Aig_Obj_t *)((ulong)pVVar6->pArray[lVar7] & 0xfffffffffffffffe),vFrontier)
            ;
            lVar7 = lVar7 + 1;
            pVVar6 = p->vFanins;
          } while (lVar7 < pVVar6->nSize);
        }
        Dch_AddClausesSuper(p,pNode,pVVar6);
      }
      else {
        pVVar6 = p->vFanins;
        pVVar6->nSize = 0;
        uVar3 = *(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 8);
        if (pVVar6->nCap == 0) {
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar6->pArray,0x80);
          }
          pVVar6->pArray = ppvVar5;
          pVVar6->nCap = 0x10;
        }
        iVar4 = pVVar6->nSize;
        pVVar6->nSize = iVar4 + 1;
        pVVar6->pArray[iVar4] = (void *)(uVar3 & 0xfffffffffffffffe);
        pVVar6 = p->vFanins;
        pvVar8 = (void *)(*(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) + 8) &
                         0xfffffffffffffffe);
        uVar1 = pVVar6->nSize;
        if (0 < (long)(int)uVar1) {
          lVar7 = 0;
          do {
            if (pVVar6->pArray[lVar7] == pvVar8) goto LAB_0093db14;
            lVar7 = lVar7 + 1;
          } while ((int)uVar1 != lVar7);
        }
        uVar2 = pVVar6->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar6->pArray,0x80);
            }
            pVVar6->pArray = ppvVar5;
            iVar4 = 0x10;
          }
          else {
            iVar4 = uVar2 * 2;
            if (iVar4 <= (int)uVar2) goto LAB_0093db01;
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar6->pArray,(ulong)uVar2 << 4);
            }
            pVVar6->pArray = ppvVar5;
          }
          pVVar6->nCap = iVar4;
        }
LAB_0093db01:
        iVar4 = pVVar6->nSize;
        pVVar6->nSize = iVar4 + 1;
        pVVar6->pArray[iVar4] = pvVar8;
LAB_0093db14:
        pVVar6 = p->vFanins;
        pvVar8 = (void *)(*(ulong *)(((ulong)pNode->pFanin0 & 0xfffffffffffffffe) + 0x10) &
                         0xfffffffffffffffe);
        uVar1 = pVVar6->nSize;
        if (0 < (long)(int)uVar1) {
          lVar7 = 0;
          do {
            if (pVVar6->pArray[lVar7] == pvVar8) goto LAB_0093dbc8;
            lVar7 = lVar7 + 1;
          } while ((int)uVar1 != lVar7);
        }
        uVar2 = pVVar6->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar6->pArray,0x80);
            }
            pVVar6->pArray = ppvVar5;
            iVar4 = 0x10;
          }
          else {
            iVar4 = uVar2 * 2;
            if (iVar4 <= (int)uVar2) goto LAB_0093dbb5;
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar6->pArray,(ulong)uVar2 << 4);
            }
            pVVar6->pArray = ppvVar5;
          }
          pVVar6->nCap = iVar4;
        }
LAB_0093dbb5:
        iVar4 = pVVar6->nSize;
        pVVar6->nSize = iVar4 + 1;
        pVVar6->pArray[iVar4] = pvVar8;
LAB_0093dbc8:
        pVVar6 = p->vFanins;
        pvVar8 = (void *)(*(ulong *)(((ulong)pNode->pFanin1 & 0xfffffffffffffffe) + 0x10) &
                         0xfffffffffffffffe);
        uVar1 = pVVar6->nSize;
        if (0 < (long)(int)uVar1) {
          lVar7 = 0;
          do {
            if (pVVar6->pArray[lVar7] == pvVar8) goto LAB_0093dc7c;
            lVar7 = lVar7 + 1;
          } while ((int)uVar1 != lVar7);
        }
        uVar2 = pVVar6->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar6->pArray,0x80);
            }
            pVVar6->pArray = ppvVar5;
            iVar4 = 0x10;
          }
          else {
            iVar4 = uVar2 * 2;
            if (iVar4 <= (int)uVar2) goto LAB_0093dc69;
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar6->pArray,(ulong)uVar2 << 4);
            }
            pVVar6->pArray = ppvVar5;
          }
          pVVar6->nCap = iVar4;
        }
LAB_0093dc69:
        iVar4 = pVVar6->nSize;
        pVVar6->nSize = iVar4 + 1;
        pVVar6->pArray[iVar4] = pvVar8;
LAB_0093dc7c:
        pVVar6 = p->vFanins;
        if (0 < pVVar6->nSize) {
          lVar7 = 0;
          do {
            Dch_ObjAddToFrontier
                      (p,(Aig_Obj_t *)((ulong)pVVar6->pArray[lVar7] & 0xfffffffffffffffe),vFrontier)
            ;
            lVar7 = lVar7 + 1;
            pVVar6 = p->vFanins;
          } while (lVar7 < pVVar6->nSize);
        }
        Dch_AddClausesMux(p,pNode);
      }
      if (p->vFanins->nSize < 2) {
        __assert_fail("Vec_PtrSize(p->vFanins) > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/dch/dchCnf.c"
                      ,0x141,"void Dch_CnfNodeAddToSolver(Dch_Man_t *, Aig_Obj_t *)");
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < vFrontier->nSize);
  }
  if (vFrontier->pArray != (void **)0x0) {
    free(vFrontier->pArray);
    vFrontier->pArray = (void **)0x0;
  }
  free(vFrontier);
  return;
}

Assistant:

void Dch_CnfNodeAddToSolver( Dch_Man_t * p, Aig_Obj_t * pObj )
{ 
    Vec_Ptr_t * vFrontier;
    Aig_Obj_t * pNode, * pFanin;
    int i, k, fUseMuxes = 1;
    // quit if CNF is ready
    if ( Dch_ObjSatNum(p,pObj) )
        return;
    // start the frontier
    vFrontier = Vec_PtrAlloc( 100 );
    Dch_ObjAddToFrontier( p, pObj, vFrontier );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Aig_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Dch_ObjSatNum(p,pNode) );
        if ( fUseMuxes && Aig_ObjIsMuxType(pNode) )
        {
            Vec_PtrClear( p->vFanins );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin0( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin0( Aig_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin1( Aig_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( p->vFanins, Aig_ObjFanin1( Aig_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Aig_Obj_t *, p->vFanins, pFanin, k )
                Dch_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Dch_AddClausesMux( p, pNode );
        }
        else
        {
            Dch_CollectSuper( pNode, fUseMuxes, p->vFanins );
            Vec_PtrForEachEntry( Aig_Obj_t *, p->vFanins, pFanin, k )
                Dch_ObjAddToFrontier( p, Aig_Regular(pFanin), vFrontier );
            Dch_AddClausesSuper( p, pNode, p->vFanins );
        }
        assert( Vec_PtrSize(p->vFanins) > 1 );
    }
    Vec_PtrFree( vFrontier );
}